

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QStatusBarPrivate::SBItem>::copyAppend
          (QGenericArrayOps<QStatusBarPrivate::SBItem> *this,SBItem *b,SBItem *e)

{
  qsizetype *pqVar1;
  SBItem *pSVar2;
  SBItem *pSVar3;
  int iVar4;
  ItemCategory IVar5;
  
  if (b != e) {
    pSVar3 = (this->super_QArrayDataPointer<QStatusBarPrivate::SBItem>).ptr;
    for (; b < e; b = b + 1) {
      iVar4 = b->stretch;
      IVar5 = b->category;
      pSVar2 = pSVar3 + (this->super_QArrayDataPointer<QStatusBarPrivate::SBItem>).size;
      pSVar2->widget = b->widget;
      pSVar2->stretch = iVar4;
      pSVar2->category = IVar5;
      pqVar1 = &(this->super_QArrayDataPointer<QStatusBarPrivate::SBItem>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }